

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall
TPZMatrix<std::complex<long_double>_>::Subst_Diag
          (TPZMatrix<std::complex<long_double>_> *this,TPZFMatrix<std::complex<long_double>_> *B)

{
  int iVar1;
  undefined4 extraout_var;
  int extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar2;
  long lVar3;
  unkbyte10 in_ST0;
  unkbyte10 Var4;
  unkbyte10 in_ST1;
  unkbyte10 Var5;
  unkbyte10 in_ST2;
  unkbyte10 in_ST3;
  complex<long_double> __r;
  complex<long_double> pivot;
  unkbyte10 Var6;
  unkbyte10 Var7;
  unkbyte10 Var8;
  unkbyte10 Var9;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined2 uStack_90;
  undefined2 uStack_8e;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined2 uStack_80;
  undefined2 uStack_7e;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  unkbyte10 local_58;
  unkbyte10 local_48;
  
  lVar3 = (B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow;
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  if (lVar3 != CONCAT44(extraout_var,iVar1)) {
    Error("TPZMatrix::Subst_Diag incompatible dimensions\n",(char *)0x0);
  }
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
  if (CONCAT44(extraout_var_00,iVar1) != 0 && -1 < extraout_var_00) {
    lVar3 = 0;
    do {
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (&local_58,this,lVar3,lVar3);
      if (0 < (B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol) {
        lVar2 = 0;
        Var4 = in_ST0;
        Var5 = in_ST1;
        do {
          in_ST1 = in_ST3;
          in_ST0 = in_ST2;
          (*(B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(&local_78,B,lVar3,lVar2);
          local_98 = local_78;
          uStack_94 = uStack_74;
          uStack_90 = (undefined2)uStack_70;
          uStack_8e = (undefined2)((uint)uStack_70 >> 0x10);
          uStack_8c = uStack_6c;
          local_88 = local_68;
          uStack_84 = uStack_64;
          uStack_80 = (undefined2)uStack_60;
          uStack_7e = (undefined2)((uint)uStack_60 >> 0x10);
          uStack_7c = uStack_5c;
          Var6 = CONCAT28(uStack_90,CONCAT44(uStack_74,local_78));
          Var7 = CONCAT28(uStack_80,CONCAT44(uStack_64,local_68));
          in_ST2 = in_ST1;
          in_ST3 = in_ST1;
          Var8 = local_58;
          Var9 = local_48;
          __divxc3();
          local_98 = (undefined4)Var4;
          uStack_94 = (undefined4)((unkuint10)Var4 >> 0x20);
          uStack_90 = (undefined2)((unkuint10)Var4 >> 0x40);
          local_88 = (undefined4)Var5;
          uStack_84 = (undefined4)((unkuint10)Var5 >> 0x20);
          uStack_80 = (undefined2)((unkuint10)Var5 >> 0x40);
          (*(B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x23])(B,lVar3,lVar2,&local_98,in_R8,in_R9,Var6,Var7,Var8,Var9);
          lVar2 = lVar2 + 1;
          Var4 = in_ST0;
          Var5 = in_ST1;
        } while (lVar2 < (B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol);
      }
      lVar3 = lVar3 + 1;
      iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    } while (lVar3 < CONCAT44(extraout_var_01,iVar1));
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Subst_Diag( TPZFMatrix<TVar> *B ) const {
    if ( (B->Rows() != Dim())) {
        Error("TPZMatrix::Subst_Diag incompatible dimensions\n");
	}
	for ( int64_t r = 0; r < Dim(); r++ ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols(); c++ ) {
			B->PutVal( r, c, B->GetVal( r, c ) / pivot );
		}
	}
	return( 1 );
}